

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O0

void * ngx_hash_find(ngx_hash_t *hash,ngx_uint_t key,u_char *name,size_t len)

{
  ngx_hash_elt_t *local_40;
  ngx_hash_elt_t *elt;
  ngx_uint_t i;
  size_t len_local;
  u_char *name_local;
  ngx_uint_t key_local;
  ngx_hash_t *hash_local;
  
  local_40 = hash->buckets[key % hash->size];
  if (local_40 != (ngx_hash_elt_t *)0x0) {
    for (; local_40->value != (void *)0x0;
        local_40 = (ngx_hash_elt_t *)
                   ((ulong)(local_40[1].name + (long)(int)(uint)local_40->len + -9) &
                   0xfffffffffffffff8)) {
      if (len == local_40->len) {
        elt = (ngx_hash_elt_t *)0x0;
        while( true ) {
          if (len <= elt) {
            return local_40->value;
          }
          if (name[(long)elt] != elt->name[(long)(local_40->name + -10)]) break;
          elt = (ngx_hash_elt_t *)((long)&elt->value + 1);
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
ngx_hash_find(ngx_hash_t *hash, ngx_uint_t key, u_char *name, size_t len)
{
    ngx_uint_t       i;
    ngx_hash_elt_t  *elt;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "hf:\"%*s\"", len, name);
#endif

    elt = hash->buckets[key % hash->size];

    if (elt == NULL) {
        return NULL;
    }

    while (elt->value) {
        if (len != (size_t) elt->len) {
            goto next;
        }

        for (i = 0; i < len; i++) {
            if (name[i] != elt->name[i]) {
                goto next;
            }
        }

        return elt->value;

    next:

        elt = (ngx_hash_elt_t *) ngx_align_ptr(&elt->name[0] + elt->len,
                                               sizeof(void *));
        continue;
    }

    return NULL;
}